

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall libcellml::Variable::removeAllEquivalences(Variable *this)

{
  EntityImpl *pEVar1;
  pointer pcVar2;
  pointer pcVar3;
  shared_ptr<libcellml::Variable> equivalentVariable;
  shared_ptr<libcellml::Variable> thisVariable;
  __shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            (local_40,(__weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                      &this->super_enable_shared_from_this<libcellml::Variable>);
  pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
  pcVar2 = pEVar1[3].mId._M_dataplus._M_p;
  for (pcVar3 = *(pointer *)((long)&pEVar1[2].mId.field_2 + 8); pcVar3 != pcVar2;
      pcVar3 = pcVar3 + 0x10) {
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,pcVar3);
    if (local_50._M_ptr != (element_type *)0x0) {
      VariableImpl::unsetEquivalentTo
                ((VariableImpl *)
                 ((local_50._M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                 (VariablePtr *)local_40);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  std::
  vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>::
  clear((vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
         *)((long)&(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.field_2
           + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

void Variable::removeAllEquivalences()
{
    auto thisVariable = shared_from_this();
    for (const auto &variable : pFunc()->mEquivalentVariables) {
        auto equivalentVariable = variable.lock();
        if (equivalentVariable != nullptr) {
            equivalentVariable->pFunc()->unsetEquivalentTo(thisVariable);
        }
    }
    pFunc()->mEquivalentVariables.clear();
}